

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_wstring_equal_string_literal(void)

{
  undefined1 local_819;
  basic_variable<std::allocator<char>_> local_818;
  undefined1 local_7db [2];
  undefined1 local_7d9;
  basic_variable<std::allocator<char>_> local_7d8;
  undefined1 local_79b [2];
  undefined1 local_799;
  basic_variable<std::allocator<char>_> local_798;
  undefined1 local_75b [2];
  undefined1 local_759;
  basic_variable<std::allocator<char>_> local_758;
  undefined1 local_71b [2];
  undefined1 local_719;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6db [2];
  undefined1 local_6d9;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  basic_variable<std::allocator<char>_> local_698;
  undefined1 local_65b [2];
  undefined1 local_659;
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_61b [2];
  undefined1 local_619;
  basic_variable<std::allocator<char>_> local_618;
  undefined1 local_5db [2];
  undefined1 local_5d9;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_59b [2];
  undefined1 local_599;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55b [2];
  undefined1 local_559;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_51b [2];
  undefined1 local_519;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45b [2];
  undefined1 local_459;
  basic_variable<std::allocator<char>_> local_458;
  undefined1 local_41b [2];
  undefined1 local_419;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3db [2];
  undefined1 local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39b [2];
  undefined1 local_399;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35b [2];
  undefined1 local_359;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  local_a[0] = trial::dynamic::operator==(&local_48,(char (*) [6])"bravo");
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == \"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x95c,"void equality_suite::compare_wstring_equal_string_literal()",local_a,&local_49)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_98,L"");
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char (*) [6])"bravo");
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != \"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x95d,"void equality_suite::compare_wstring_equal_string_literal()",local_5e,&local_99
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char (*) [1])0x244c37);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == \"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x95e,"void equality_suite::compare_wstring_equal_string_literal()",local_9b,&local_d9
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,L"bravo");
  local_db[0] = trial::dynamic::operator!=(&local_118,(char (*) [1])0x244c37);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != \"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x95f,"void equality_suite::compare_wstring_equal_string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"bravo");
  local_11b[0] = trial::dynamic::operator==(&local_158,(char (*) [6])"bravo");
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == \"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x961,"void equality_suite::compare_wstring_equal_string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  local_15b[0] = trial::dynamic::operator!=(&local_198,(char (*) [6])"bravo");
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != \"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x962,"void equality_suite::compare_wstring_equal_string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1d8,L"bravo");
  local_19b[0] = trial::dynamic::operator==(&local_1d8,(char (*) [5])"zulu");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == \"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x963,"void equality_suite::compare_wstring_equal_string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,L"bravo");
  local_1db[0] = trial::dynamic::operator!=(&local_218,(char (*) [5])"zulu");
  local_219 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != \"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x964,"void equality_suite::compare_wstring_equal_string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_258,L"");
  local_21b[0] = trial::dynamic::operator==(&local_258,(wchar_t (*) [6])L"bravo");
  local_259 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == L\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x968,"void equality_suite::compare_wstring_equal_string_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_298,L"");
  local_25b[0] = trial::dynamic::operator!=(&local_298,(wchar_t (*) [6])L"bravo");
  local_299 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != L\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x969,"void equality_suite::compare_wstring_equal_string_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2d8,L"bravo");
  local_29b[0] = trial::dynamic::operator==(&local_2d8,(wchar_t (*) [1])0x247f68);
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == L\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x96a,"void equality_suite::compare_wstring_equal_string_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,L"bravo");
  local_2db[0] = trial::dynamic::operator!=(&local_318,(wchar_t (*) [1])0x247f68);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != L\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x96b,"void equality_suite::compare_wstring_equal_string_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"bravo");
  local_31b[0] = trial::dynamic::operator==(&local_358,(wchar_t (*) [6])L"bravo");
  local_359 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == L\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x96d,"void equality_suite::compare_wstring_equal_string_literal()",local_31b,
             &local_359);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_398,L"bravo");
  local_35b[0] = trial::dynamic::operator!=(&local_398,(wchar_t (*) [6])L"bravo");
  local_399 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != L\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x96e,"void equality_suite::compare_wstring_equal_string_literal()",local_35b,
             &local_399);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3d8,L"bravo");
  local_39b[0] = trial::dynamic::operator==(&local_3d8,(wchar_t (*) [5])L"zulu");
  local_3d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == L\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x96f,"void equality_suite::compare_wstring_equal_string_literal()",local_39b,
             &local_3d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_418,L"bravo");
  local_3db[0] = trial::dynamic::operator!=(&local_418,(wchar_t (*) [5])L"zulu");
  local_419 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != L\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x970,"void equality_suite::compare_wstring_equal_string_literal()",local_3db,
             &local_419);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_458,L"");
  local_41b[0] = trial::dynamic::operator==(&local_458,(char16_t (*) [6])L"bravo");
  local_459 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == u\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x974,"void equality_suite::compare_wstring_equal_string_literal()",local_41b,
             &local_459);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_498,L"");
  local_45b[0] = trial::dynamic::operator!=(&local_498,(char16_t (*) [6])L"bravo");
  local_499 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != u\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x975,"void equality_suite::compare_wstring_equal_string_literal()",local_45b,
             &local_499);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4d8,L"bravo");
  local_49b[0] = trial::dynamic::operator==(&local_4d8,(char16_t (*) [1])0x247fba);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x976,"void equality_suite::compare_wstring_equal_string_literal()",local_49b,
             &local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,L"bravo");
  local_4db[0] = trial::dynamic::operator!=(&local_518,(char16_t (*) [1])0x247fba);
  local_519 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x977,"void equality_suite::compare_wstring_equal_string_literal()",local_4db,
             &local_519);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_558,L"bravo");
  local_51b[0] = trial::dynamic::operator==(&local_558,(char16_t (*) [6])L"bravo");
  local_559 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == u\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x979,"void equality_suite::compare_wstring_equal_string_literal()",local_51b,
             &local_559);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_598,L"bravo");
  local_55b[0] = trial::dynamic::operator!=(&local_598,(char16_t (*) [6])L"bravo");
  local_599 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != u\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x97a,"void equality_suite::compare_wstring_equal_string_literal()",local_55b,
             &local_599);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5d8,L"bravo");
  local_59b[0] = trial::dynamic::operator==(&local_5d8,(char16_t (*) [5])L"zulu");
  local_5d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == u\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x97b,"void equality_suite::compare_wstring_equal_string_literal()",local_59b,
             &local_5d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_618,L"bravo");
  local_5db[0] = trial::dynamic::operator!=(&local_618,(char16_t (*) [5])L"zulu");
  local_619 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != u\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x97c,"void equality_suite::compare_wstring_equal_string_literal()",local_5db,
             &local_619);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_658,L"");
  local_61b[0] = trial::dynamic::operator==(&local_658,(char32_t (*) [6])L"bravo");
  local_659 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == U\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x980,"void equality_suite::compare_wstring_equal_string_literal()",local_61b,
             &local_659);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_698,L"");
  local_65b[0] = trial::dynamic::operator!=(&local_698,(char32_t (*) [6])L"bravo");
  local_699 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != U\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x981,"void equality_suite::compare_wstring_equal_string_literal()",local_65b,
             &local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,L"bravo");
  local_69b[0] = trial::dynamic::operator==(&local_6d8,(char32_t (*) [1])0x247f68);
  local_6d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == U\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x982,"void equality_suite::compare_wstring_equal_string_literal()",local_69b,
             &local_6d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_718,L"bravo");
  local_6db[0] = trial::dynamic::operator!=(&local_718,(char32_t (*) [1])0x247f68);
  local_719 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != U\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x983,"void equality_suite::compare_wstring_equal_string_literal()",local_6db,
             &local_719);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_758,L"bravo");
  local_71b[0] = trial::dynamic::operator==(&local_758,(char32_t (*) [6])L"bravo");
  local_759 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == U\"bravo\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x985,"void equality_suite::compare_wstring_equal_string_literal()",local_71b,
             &local_759);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_798,L"bravo");
  local_75b[0] = trial::dynamic::operator!=(&local_798,(char32_t (*) [6])L"bravo");
  local_799 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != U\"bravo\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x986,"void equality_suite::compare_wstring_equal_string_literal()",local_75b,
             &local_799);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7d8,L"bravo");
  local_79b[0] = trial::dynamic::operator==(&local_7d8,(char32_t (*) [5])L"zulu");
  local_7d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == U\"zulu\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x987,"void equality_suite::compare_wstring_equal_string_literal()",local_79b,
             &local_7d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_818,L"bravo");
  local_7db[0] = trial::dynamic::operator!=(&local_818,(char32_t (*) [5])L"zulu");
  local_819 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != U\"zulu\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x988,"void equality_suite::compare_wstring_equal_string_literal()",local_7db,
             &local_819);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  return;
}

Assistant:

void compare_wstring_equal_string_literal()
{
    // wstring - string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == "bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != "bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == "", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != "", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == "bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != "bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == "zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != "zulu", true);
    }
    // wstring - wstring literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == L"bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != L"bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == L"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != L"", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == L"bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != L"bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == L"zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != L"zulu", true);
    }
    // wstring - u16string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == u"bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != u"bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == u"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != u"", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == u"bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != u"bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == u"zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != u"zulu", true);
    }
    // wstring - u32string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == U"bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != U"bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == U"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != U"", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == U"bravo", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != U"bravo", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == U"zulu", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != U"zulu", true);
    }
}